

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_linear_resampler_get_heap_layout
                    (ma_linear_resampler_config *pConfig,
                    ma_linear_resampler_heap_layout *pHeapLayout)

{
  undefined1 local_60 [8];
  ma_lpf_config lpfConfig;
  size_t lpfHeapSizeInBytes;
  ma_result result;
  ma_linear_resampler_heap_layout *pHeapLayout_local;
  ma_linear_resampler_config *pConfig_local;
  
  if (pHeapLayout != (ma_linear_resampler_heap_layout *)0x0) {
    memset(pHeapLayout,0,0x20);
    if (pConfig == (ma_linear_resampler_config *)0x0) {
      pConfig_local._4_4_ = MA_INVALID_ARGS;
    }
    else if ((pConfig->format == ma_format_f32) || (pConfig->format == ma_format_s16)) {
      if (pConfig->channels == 0) {
        pConfig_local._4_4_ = MA_INVALID_ARGS;
      }
      else {
        pHeapLayout->sizeInBytes = 0;
        pHeapLayout->x0Offset = pHeapLayout->sizeInBytes;
        if (pConfig->format == ma_format_f32) {
          pHeapLayout->sizeInBytes = (ulong)pConfig->channels * 4 + pHeapLayout->sizeInBytes;
        }
        else {
          pHeapLayout->sizeInBytes = (ulong)pConfig->channels * 2 + pHeapLayout->sizeInBytes;
        }
        pHeapLayout->x1Offset = pHeapLayout->sizeInBytes;
        if (pConfig->format == ma_format_f32) {
          pHeapLayout->sizeInBytes = (ulong)pConfig->channels * 4 + pHeapLayout->sizeInBytes;
        }
        else {
          pHeapLayout->sizeInBytes = (ulong)pConfig->channels * 2 + pHeapLayout->sizeInBytes;
        }
        pHeapLayout->lpfOffset = pHeapLayout->sizeInBytes + 7 & 0xfffffffffffffff8;
        ma_lpf_config_init((ma_lpf_config *)local_60,pConfig->format,pConfig->channels,1,1.0,
                           pConfig->lpfOrder);
        pConfig_local._4_4_ =
             ma_lpf_get_heap_size((ma_lpf_config *)local_60,(size_t *)&lpfConfig.order);
        if (pConfig_local._4_4_ == MA_SUCCESS) {
          pHeapLayout->sizeInBytes = lpfConfig._24_8_ + pHeapLayout->sizeInBytes;
          pHeapLayout->sizeInBytes = pHeapLayout->sizeInBytes + 7 & 0xfffffffffffffff8;
          pConfig_local._4_4_ = MA_SUCCESS;
        }
      }
    }
    else {
      pConfig_local._4_4_ = MA_INVALID_ARGS;
    }
    return pConfig_local._4_4_;
  }
  __assert_fail("pHeapLayout != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x966f,
                "ma_result ma_linear_resampler_get_heap_layout(const ma_linear_resampler_config *, ma_linear_resampler_heap_layout *)"
               );
}

Assistant:

static ma_result ma_linear_resampler_get_heap_layout(const ma_linear_resampler_config* pConfig, ma_linear_resampler_heap_layout* pHeapLayout)
{
    MA_ASSERT(pHeapLayout != NULL);

    MA_ZERO_OBJECT(pHeapLayout);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->channels == 0) {
        return MA_INVALID_ARGS;
    }

    pHeapLayout->sizeInBytes = 0;

    /* x0 */
    pHeapLayout->x0Offset = pHeapLayout->sizeInBytes;
    if (pConfig->format == ma_format_f32) {
        pHeapLayout->sizeInBytes += sizeof(float) * pConfig->channels;
    } else {
        pHeapLayout->sizeInBytes += sizeof(ma_int16) * pConfig->channels;
    }

    /* x1 */
    pHeapLayout->x1Offset = pHeapLayout->sizeInBytes;
    if (pConfig->format == ma_format_f32) {
        pHeapLayout->sizeInBytes += sizeof(float) * pConfig->channels;
    } else {
        pHeapLayout->sizeInBytes += sizeof(ma_int16) * pConfig->channels;
    }

    /* LPF */
    pHeapLayout->lpfOffset = ma_align_64(pHeapLayout->sizeInBytes);
    {
        ma_result result;
        size_t lpfHeapSizeInBytes;
        ma_lpf_config lpfConfig = ma_lpf_config_init(pConfig->format, pConfig->channels, 1, 1, pConfig->lpfOrder);  /* Sample rate and cutoff frequency do not matter. */

        result = ma_lpf_get_heap_size(&lpfConfig, &lpfHeapSizeInBytes);
        if (result != MA_SUCCESS) {
            return result;
        }

        pHeapLayout->sizeInBytes += lpfHeapSizeInBytes;
    }

    /* Make sure allocation size is aligned. */
    pHeapLayout->sizeInBytes = ma_align_64(pHeapLayout->sizeInBytes);

    return MA_SUCCESS;
}